

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
nnad::FeedForwardNN<double>::Evaluate
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          FeedForwardNN<double> *this,vector<double,_std::allocator<double>_> *Input)

{
  pointer *this_00;
  pointer piVar1;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *__args;
  FeedForwardNN<double> *pFVar2;
  mapped_type *pmVar3;
  int *piVar4;
  int local_124;
  ulong local_120;
  vector<double,_std::allocator<double>_> *local_118;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *local_110;
  vector<double,_std::allocator<double>_> prep;
  Matrix<double> y;
  Matrix<double> local_c8;
  vector<double,_std::allocator<double>_> *local_a8;
  FeedForwardNN<double> *local_a0;
  key_type local_94;
  Matrix<double> local_90;
  function<double_(const_double_&)> local_70;
  function<double_(const_double_&)> local_50;
  
  piVar4 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  prep.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = (int)((ulong)((long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  if (*piVar4 !=
      (int)prep.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&y,
               "Evaluate: the number of inputs does not match the number of input nodes.",
               (allocator<char> *)&prep);
    Error((string *)&y);
    std::__cxx11::string::~string((string *)&y);
    piVar4 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    prep.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ =
         (int)((ulong)((long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
  }
  piVar1 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_c8._Lines = 1;
  local_118 = __return_storage_ptr__;
  local_a8 = Input;
  Matrix<double>::Matrix(&y,(int *)&prep,&local_c8._Lines,Input);
  local_120 = (ulong)((int)((ulong)((long)piVar1 - (long)piVar4) >> 2) - 1);
  local_110 = &this->_Biases;
  local_a0 = this;
  for (local_124 = 1; local_124 < (int)local_120; local_124 = local_124 + 1) {
    pmVar3 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(&this->_Links,&local_124);
    Matrix<double>::operator*(&local_90,pmVar3,&y);
    pmVar3 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(local_110,&local_124);
    Matrix<double>::operator+(&local_c8,&local_90,pmVar3);
    std::function<double_(const_double_&)>::function(&local_50,&this->_ActFun);
    Matrix<double>::Matrix((Matrix<double> *)&prep,&local_c8,&local_50);
    Matrix<double>::operator=(&y,(Matrix<double> *)&prep);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &prep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_c8._Matrix.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_90._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  }
  local_124 = (int)local_120;
  pmVar3 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::at(&this->_Links,&local_124);
  Matrix<double>::operator*(&local_90,pmVar3,&y);
  local_94 = (key_type)local_120;
  pmVar3 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::at(local_110,&local_94);
  pFVar2 = local_a0;
  __args = local_a8;
  this_01 = local_118;
  Matrix<double>::operator+(&local_c8,&local_90,pmVar3);
  std::function<double_(const_double_&)>::function(&local_70,&pFVar2->_OutputActFun);
  Matrix<double>::Matrix((Matrix<double> *)&prep,&local_c8,&local_70);
  this_00 = &prep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            (this_01,(vector<double,_std::allocator<double>_> *)this_00);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this_00);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_c8._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_90._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  if ((pFVar2->_Preproc).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()(&prep,&pFVar2->_Preproc,__args,&pFVar2->_PreprocPars);
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::multiplies<double>>
              ((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               CONCAT44(prep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)prep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start));
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&prep.super__Vector_base<double,_std::allocator<double>_>);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  return this_01;
}

Assistant:

std::vector<T> Evaluate(std::vector<T> const& Input) const
    {
      // Check that the size of the input vector is equal to the number of
      // input nodes.
      if ((int) Input.size() != _Arch[0])
        Error("Evaluate: the number of inputs does not match the number of input nodes.");

      // Number of layers
      const int nl = (int) _Arch.size();

      // Construct output of the NN recursively for the hidden layers
      Matrix<T> y{(int) Input.size(), 1, Input};
      for (int l = 1; l < nl - 1; l++)
        y = Matrix<T> {_Links.at(l) * y + _Biases.at(l), _ActFun};

      // Compute NN
      std::vector<T> NN = (Matrix<T> {_Links.at(nl - 1) * y + _Biases.at(nl - 1), _OutputActFun}).GetVector();

      // Include preprocessing function if necessary
      if (_Preproc != nullptr)
        {
          const std::vector<T> prep = _Preproc(Input, _PreprocPars);
          std::transform(NN.begin(), NN.end(), prep.begin(), NN.begin(), std::multiplies<T>());
        }

      return NN;
    }